

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorWithOneEmptyUnit_Test::TestBody(Units_scalingFactorWithOneEmptyUnit_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_118 [8];
  Message local_110 [8];
  double local_108;
  double local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0 [8];
  double local_d8;
  double local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Units_scalingFactorWithOneEmptyUnit_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"u1",&local_41);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"u2",&local_89);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,0xe,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_d0 = 0.0;
  local_d8 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)local_20,(shared_ptr *)local_68,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_c8,"0.0","libcellml::Units::scalingFactor(u1, u2)",&local_d0,
             &local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x470,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_100 = 0.0;
  local_108 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_68,(shared_ptr *)local_20,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_f8,"0.0","libcellml::Units::scalingFactor(u2, u1)",&local_100,
             &local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x471,pcVar3);
    testing::internal::AssertHelper::operator=(local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, scalingFactorWithOneEmptyUnit)
{
    // Add unit with no members
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LITRE, 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}